

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

unit_data __thiscall units::detail::unit_data::root(unit_data *this,int power)

{
  unit_data uVar1;
  ulong uVar2;
  bool bVar3;
  unit_data local_3c;
  ulong local_38;
  
  bVar3 = hasValidRoot(this,power);
  if (bVar3) {
    uVar1 = *this;
    uVar2 = (long)(((int)uVar1 << 0xb) >> 0x1e) / (long)power;
    local_38 = uVar2 & 0xffffffff;
    unit_data(&local_3c,(((int)uVar1 << 0x1c) >> 0x1c) / power,
              (((int)uVar1 << 0x15) >> 0x1d) / power,((int)uVar1._0_1_ >> 4) / power,
              (((int)uVar1 << 0x12) >> 0x1d) / power,(((int)uVar1 << 0xd) >> 0x1d) / power,
              (int)uVar2,((int)uVar1._0_2_ >> 0xe) / power,(((int)uVar1 << 6) >> 0x1e) / power,
              (((int)uVar1 << 4) >> 0x1e) / power,(((int)uVar1 << 8) >> 0x1d) / power,
              (uint)uVar1 >> 0x1c & 1,(uint)uVar1 >> 0x1d & power & 1,(uint)uVar1 >> 0x1e & 1,0);
  }
  else {
    local_3c = (unit_data)0xfa94a488;
  }
  return local_3c;
}

Assistant:

constexpr unit_data root(int power) const
        {
            return (hasValidRoot(power)) ? unit_data(
                                               meter_ / power,
                                               kilogram_ / power,
                                               second_ / power,
                                               ampere_ / power,
                                               kelvin_ / power,
                                               mole_ / power,
                                               candela_ / power,
                                               currency_ / power,
                                               count_ / power,
                                               radians_ / power,
                                               per_unit_,
                                               (power % 2 == 0) ? 0U : i_flag_,
                                               e_flag_,
                                               0) :
                                           unit_data(nullptr);
        }